

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O1

void cgltf_write_indent(cgltf_write_context *context)

{
  int iVar1;
  int iVar2;
  cgltf_size cVar3;
  
  if (context->needs_comma == 0) {
    iVar1 = snprintf(context->cursor,context->remaining,"\n");
    cVar3 = (cgltf_size)iVar1;
    context->tmp = cVar3;
    context->chars_written = context->chars_written + cVar3;
    if (context->cursor != (char *)0x0) {
      context->cursor = context->cursor + cVar3;
      context->remaining = context->remaining - cVar3;
    }
  }
  else {
    iVar1 = snprintf(context->cursor,context->remaining,",\n");
    cVar3 = (cgltf_size)iVar1;
    context->tmp = cVar3;
    context->chars_written = context->chars_written + cVar3;
    if (context->cursor != (char *)0x0) {
      context->cursor = context->cursor + cVar3;
      context->remaining = context->remaining - cVar3;
    }
    context->needs_comma = 0;
  }
  if (0 < context->depth) {
    iVar1 = 0;
    do {
      iVar2 = snprintf(context->cursor,context->remaining,"%s",context->indent);
      cVar3 = (cgltf_size)iVar2;
      context->tmp = cVar3;
      context->chars_written = context->chars_written + cVar3;
      if (context->cursor != (char *)0x0) {
        context->cursor = context->cursor + cVar3;
        context->remaining = context->remaining - cVar3;
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < context->depth);
  }
  return;
}

Assistant:

static void cgltf_write_indent(cgltf_write_context* context)
{
	if (context->needs_comma)
	{
		CGLTF_SPRINTF(",\n");
		context->needs_comma = 0;
	}
	else
	{
		CGLTF_SPRINTF("\n");
	}
	for (int i = 0; i < context->depth; ++i)
	{
		CGLTF_SPRINTF("%s", context->indent);
	}
}